

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O3

int amqp_device_delayed_stop(AMQP_DEVICE_HANDLE handle,size_t delay_secs)

{
  DEVICE_STATE DVar1;
  ON_DEVICE_STATE_CHANGED p_Var2;
  int iVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x38b;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x38b;
    }
    pcVar6 = "Failed stopping device (handle is NULL)";
    iVar5 = 0x38a;
  }
  else if (handle->state < DEVICE_STATE_STARTING) {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x394;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x394;
    }
    pcVar6 = "Failed stopping device \'%s\' (device is already stopped or stopping)";
    iVar5 = 0x393;
  }
  else {
    iVar3 = tickcounter_get_current_ms(handle->tick_counter_handle,&handle->last_stop_request_time);
    if (iVar3 == 0) {
      DVar1 = handle->state;
      if (DVar1 != DEVICE_STATE_STOPPING) {
        handle->state = DEVICE_STATE_STOPPING;
        p_Var2 = handle->config->on_state_changed_callback;
        if (p_Var2 != (ON_DEVICE_STATE_CHANGED)0x0) {
          (*p_Var2)(handle->config->on_state_changed_context,DVar1,DEVICE_STATE_STOPPING);
        }
      }
      handle->stop_delay_ms = delay_secs * 1000;
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x399;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x399;
    }
    pcVar6 = "Failed stopping device \'%s\' (could not get tickcounter time)";
    iVar5 = 0x398;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
            ,"amqp_device_delayed_stop",iVar5,1,pcVar6);
  return iVar3;
}

Assistant:

int amqp_device_delayed_stop(AMQP_DEVICE_HANDLE handle, size_t delay_secs)
{
    int result;

    if (handle == NULL)
    {
        LogError("Failed stopping device (handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

        if (instance->state == DEVICE_STATE_STOPPED || instance->state == DEVICE_STATE_STOPPING)
        {
            LogError("Failed stopping device '%s' (device is already stopped or stopping)", instance->config->device_id);
            result = MU_FAILURE;
        }
        else if (tickcounter_get_current_ms(instance->tick_counter_handle, &instance->last_stop_request_time) != 0)
        {
            LogError("Failed stopping device '%s' (could not get tickcounter time)", instance->config->device_id);
            result = MU_FAILURE;
        }
        else
        {
            update_state(instance, DEVICE_STATE_STOPPING);
            instance->stop_delay_ms = delay_secs * 1000;
            result = RESULT_OK;
        }
    }

    return result;
}